

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O2

void finishFTSession(string *id,UDPClient *client)

{
  IndexedFile *__args;
  __type __args_1;
  iterator iVar1;
  char *pcVar2;
  undefined1 local_1d0 [8];
  string check;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pthread_mutex_lock((pthread_mutex_t *)(ftSessionMutex + 1));
  iVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)client,id);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
      ._M_cur != (__node_type *)0x0) {
    nite::FileTransfer::FTSession::close
              ((FTSession *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                      ._M_cur + 0x28),(int)id);
    __args = (IndexedFile *)
             ((long)iVar1.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                    ._M_cur + 0x60);
    nite::hashFile((string *)local_1d0,(string *)__args);
    __args_1 = std::operator==((string *)local_1d0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               ((long)iVar1.
                                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                                      ._M_cur + 0x80));
    if (*(char *)((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                        ._M_cur + 0xd8) == '\0') {
      std::operator+(&local_70,"FT ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                            ._M_cur + 0x310));
      std::operator+(&local_90,&local_70," finished file \'");
      std::operator+(&local_b0,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)iVar1.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                            ._M_cur + 0x80));
      std::operator+(&local_d0,&local_b0,"\' ");
      pcVar2 = "from";
      if (*(char *)((long)iVar1.
                          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                          ._M_cur + 0xd8) != '\0') {
        pcVar2 = "to";
      }
      std::operator+(&local_f0,&local_d0,pcVar2);
      std::operator+(&local_110,&local_f0," ");
      nite::IP_Port::operator_cast_to_string
                (&local_50,
                 (IP_Port *)
                 ((long)iVar1.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                        ._M_cur + 0x38));
      std::operator+(&local_130,&local_110,&local_50);
      std::operator+(&local_150,&local_130," saved as \'");
      std::operator+(&local_170,&local_150,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__args);
      std::operator+(&local_190,&local_170,"\': checksum match: ");
      pcVar2 = "false";
      if (__args_1) {
        pcVar2 = "true";
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&check.field_2 + 8),&local_190,pcVar2);
      nite::print((string *)((long)&check.field_2 + 8));
      std::__cxx11::string::~string((string *)(check.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)&local_190);
      std::__cxx11::string::~string((string *)&local_170);
      std::__cxx11::string::~string((string *)&local_150);
      std::__cxx11::string::~string((string *)&local_130);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    std::function<void_(const_nite::IndexedFile_&,_bool)>::operator()
              ((function<void_(const_nite::IndexedFile_&,_bool)> *)
               ((long)iVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                      ._M_cur + 0x2f0),__args,__args_1);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::_M_erase((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                *)client,
               (long)iVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nite::FileTransfer::FTSession>,_true>
                     ._M_cur + 8);
    std::__cxx11::string::~string((string *)local_1d0);
  }
  pthread_mutex_unlock((pthread_mutex_t *)(ftSessionMutex + 1));
  return;
}

Assistant:

static void finishFTSession(const String &id, nite::FileTransfer::UDPClient *client){
	pthread_mutex_lock(&ftSessionMutex[1]); 
	auto it = client->sessions.find(id);
	if(it != client->sessions.end()){
		it->second.close();
		auto &ref = it->second;
		String check = nite::hashFile(ref.indexed.path);
		bool chksm = check == ref.indexed.hash;		
		if(!ref.sender){
			nite::print("FT "+ref.id+" finished file '"+ref.indexed.hash+"' "+(ref.sender ? "to" : "from")+" "+String(ref.ip)+" saved as '"+ref.indexed.path+"': checksum match: "+(chksm ? "true" : "false"));
		}
		it->second.callback(it->second.indexed, chksm);
		client->sessions.erase(it->first);
	}
	pthread_mutex_unlock(&ftSessionMutex[1]);
}